

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBeam.h
# Opt level: O1

void __thiscall
chrono::fea::ChLoaderBeamWrenchDistributed::ChLoaderBeamWrenchDistributed
          (ChLoaderBeamWrenchDistributed *this,shared_ptr<chrono::ChLoadableU> *mloadable)

{
  shared_ptr<chrono::ChLoadableU> local_18;
  
  local_18.super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mloadable->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mloadable->super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_18.super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  ChLoaderUdistributed::ChLoaderUdistributed(&this->super_ChLoaderUdistributed,&local_18);
  if (local_18.super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChLoaderUdistributed).super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderU_00138e00;
  (this->torqueperunit).m_data[0] = 0.0;
  (this->torqueperunit).m_data[1] = 0.0;
  (this->torqueperunit).m_data[2] = 0.0;
  (this->forceperunit).m_data[0] = 0.0;
  (this->torqueperunit).m_data[2] = 0.0;
  (this->forceperunit).m_data[0] = 0.0;
  (this->forceperunit).m_data[1] = 0.0;
  (this->forceperunit).m_data[2] = 0.0;
  if (this != (ChLoaderBeamWrenchDistributed *)chrono::ChLoadCustom::LoadGet_field_ncoords) {
    (this->torqueperunit).m_data[0] = VNULL;
    (this->torqueperunit).m_data[1] = _typeinfo;
    (this->torqueperunit).m_data[2] = ___cxa_guard_release;
  }
  if (this != (ChLoaderBeamWrenchDistributed *)std::__throw_bad_array_new_length) {
    (this->forceperunit).m_data[0] = VNULL;
    (this->forceperunit).m_data[1] = _typeinfo;
    (this->forceperunit).m_data[2] = ___cxa_guard_release;
  }
  return;
}

Assistant:

ChLoaderBeamWrenchDistributed(std::shared_ptr<ChLoadableU> mloadable) : ChLoaderUdistributed(mloadable) {
        this->torqueperunit = VNULL;
        this->forceperunit = VNULL;
    }